

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O0

void ARM_getRegName(cs_struct *handle,int value)

{
  int value_local;
  cs_struct *handle_local;
  
  if (value == 3) {
    handle->get_regname = getRegisterName2;
    handle->reg_name = ARM_reg_name2;
  }
  else {
    handle->get_regname = getRegisterName;
    handle->reg_name = ARM_reg_name;
  }
  return;
}

Assistant:

void ARM_getRegName(cs_struct *handle, int value)
{
	if (value == CS_OPT_SYNTAX_NOREGNAME) {
		handle->get_regname = getRegisterName2;
		handle->reg_name = ARM_reg_name2;;
	} else {
		handle->get_regname = getRegisterName;
		handle->reg_name = ARM_reg_name;;
	}
}